

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::insertFunc
          (irGenerator *this,string *key,shared_ptr<mir::inst::MirFunction> *func)

{
  __shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  string local_190;
  MirFunction local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  local_d8;
  
  std::__cxx11::string::string
            ((string *)&local_190,
             (string *)
             &((func->super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->name);
  std::__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a0,
             &(((func->super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>
            );
  mir::inst::MirFunction::MirFunction
            (&local_170,&local_190,(shared_ptr<mir::types::FunctionTy> *)&local_1a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_mir::inst::MirFunction,_true>
            (&local_d8,key,&local_170);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mir::inst::MirFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mir::inst::MirFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>>
              *)&(this->_package).functions,&local_d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  ::~pair(&local_d8);
  mir::inst::MirFunction::~MirFunction(&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
  std::__cxx11::string::~string((string *)&local_190);
  return;
}

Assistant:

void irGenerator::insertFunc(string key,
                             shared_ptr<mir::inst::MirFunction> func) {
  _package.functions.insert(
      {key, mir::inst::MirFunction(func->name, func->type)});
}